

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboApiTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles3::Functional::FboApiCase::iterate(FboApiCase *this)

{
  Context *pCVar1;
  TestLog *log;
  RenderContext *context_00;
  int iVar2;
  deUint32 dVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  IVec4 local_1b0;
  GLContext context;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  dVar3 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(dVar3,"Before test case",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFboApiTests.cpp"
                  ,0x22d);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  pCVar1 = (this->super_TestCase).m_context;
  log = pCVar1->m_testCtx->m_log;
  context_00 = pCVar1->m_renderCtx;
  iVar4 = (*context_00->_vptr_RenderContext[4])(context_00);
  iVar4 = *(int *)CONCAT44(extraout_var_00,iVar4);
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  local_1b0.m_data[3] = *(int *)(CONCAT44(extraout_var_01,iVar5) + 4);
  local_1b0.m_data[0] = 0;
  local_1b0.m_data[1] = 0;
  local_1b0.m_data[2] = iVar4;
  sglr::GLContext::GLContext(&context,context_00,log,1,&local_1b0);
  (*this->m_testFunc)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                      &context.super_Context);
  sglr::GLContext::~GLContext(&context);
  dVar3 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(dVar3,"After test case",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFboApiTests.cpp"
                  ,0x239);
  return STOP;
}

Assistant:

TestCase::IterateResult FboApiCase::iterate (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	GLU_EXPECT_NO_ERROR(gl.getError(), "Before test case");

	// Initialize result to PASS
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// Execute test case
	{
		tcu::TestLog& log = m_context.getTestContext().getLog();
		sglr::GLContext context(m_context.getRenderContext(), log, sglr::GLCONTEXT_LOG_CALLS, tcu::IVec4(0, 0, m_context.getRenderContext().getRenderTarget().getWidth(), m_context.getRenderContext().getRenderTarget().getHeight()));
		m_testFunc(m_testCtx, context);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "After test case");

	return STOP;
}